

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint32_t nuts_be32(uint32_t in)

{
  _Bool _Var1;
  undefined4 local_c;
  uint32_t in_local;
  
  _Var1 = is_little_endian();
  local_c = in;
  if (_Var1) {
    local_c = in >> 0x18 | in >> 8 & 0xff00 | (in & 0xff00) << 8 | in << 0x18;
  }
  return local_c;
}

Assistant:

uint32_t
nuts_be32(uint32_t in)
{
	if (is_little_endian()) {
		in = ((in >> 24u) & 0xffu) | ((in >> 8u) & 0xff00u) |
		    ((in << 8u) & 0xff0000u) | ((in << 24u) & 0xff000000u);
	}
	return (in);
}